

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feat.c
# Opt level: O3

mfcc_t *** feat_array_alloc(feat_t *fcb,int32 nfr)

{
  int iVar1;
  mfcc_t ***pppmVar2;
  void *pvVar3;
  long lVar4;
  ulong uVar5;
  void *pvVar6;
  long lVar7;
  int32 iVar8;
  uint32 *puVar9;
  uint uVar10;
  
  if (fcb == (feat_t *)0x0) {
    __assert_fail("fcb",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                  ,0x169,"mfcc_t ***feat_array_alloc(feat_t *, int32)");
  }
  if (nfr < 1) {
    __assert_fail("nfr > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                  ,0x16a,"mfcc_t ***feat_array_alloc(feat_t *, int32)");
  }
  if (fcb->out_dim == 0) {
    __assert_fail("feat_dimension(fcb) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                  ,0x16b,"mfcc_t ***feat_array_alloc(feat_t *, int32)");
  }
  iVar1 = fcb->n_stream;
  if ((long)iVar1 < 1) {
    uVar10 = 0;
  }
  else {
    lVar4 = 0;
    uVar10 = 0;
    do {
      uVar10 = uVar10 + fcb->stream_len[lVar4];
      lVar4 = lVar4 + 1;
    } while (iVar1 != lVar4);
  }
  if (uVar10 < fcb->out_dim) {
    __assert_fail("k >= feat_dimension(fcb)",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                  ,0x172,"mfcc_t ***feat_array_alloc(feat_t *, int32)");
  }
  if ((int)uVar10 < fcb->sv_dim) {
    __assert_fail("k >= fcb->sv_dim",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                  ,0x173,"mfcc_t ***feat_array_alloc(feat_t *, int32)");
  }
  if (fcb->n_sv != 0) {
    iVar1 = fcb->n_sv;
  }
  pppmVar2 = (mfcc_t ***)
             __ckd_calloc_2d__((ulong)(uint)nfr,(long)iVar1,8,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                               ,0x176);
  pvVar3 = __ckd_calloc__((long)(int)(nfr * uVar10),4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                          ,0x177);
  iVar1 = fcb->n_sv;
  uVar5 = 0;
  do {
    pvVar6 = (void *)((long)pvVar3 + uVar5 * (long)(int)uVar10 * 4);
    lVar4 = 0;
    lVar7 = 0;
    while( true ) {
      iVar8 = iVar1;
      if (iVar1 == 0) {
        iVar8 = fcb->n_stream;
      }
      if (iVar8 <= lVar7) break;
      *(void **)((long)pppmVar2[uVar5] + lVar4 * 2) = pvVar6;
      puVar9 = &fcb->out_dim;
      if (fcb->lda == (mfcc_t ***)0x0) {
        if (fcb->sv_len == (uint32 *)0x0) {
          puVar9 = (uint32 *)((long)fcb->stream_len + lVar4);
        }
        else {
          puVar9 = fcb->sv_len + lVar7;
        }
      }
      pvVar6 = (void *)((long)pvVar6 + (ulong)*puVar9 * 4);
      lVar7 = lVar7 + 1;
      lVar4 = lVar4 + 4;
    }
    uVar5 = uVar5 + 1;
  } while (uVar5 != (uint)nfr);
  return pppmVar2;
}

Assistant:

mfcc_t ***
feat_array_alloc(feat_t * fcb, int32 nfr)
{
    int32 i, j, k;
    mfcc_t *data, *d, ***feat;

    assert(fcb);
    assert(nfr > 0);
    assert(feat_dimension(fcb) > 0);

    /* Make sure to use the dimensionality of the features *before*
       LDA and subvector projection. */
    k = 0;
    for (i = 0; i < fcb->n_stream; ++i)
        k += fcb->stream_len[i];
    assert(k >= feat_dimension(fcb));
    assert(k >= fcb->sv_dim);

    feat =
        (mfcc_t ***) ckd_calloc_2d(nfr, feat_dimension1(fcb), sizeof(mfcc_t *));
    data = (mfcc_t *) ckd_calloc(nfr * k, sizeof(mfcc_t));

    for (i = 0; i < nfr; i++) {
        d = data + i * k;
        for (j = 0; j < feat_dimension1(fcb); j++) {
            feat[i][j] = d;
            d += feat_dimension2(fcb, j);
        }
    }

    return feat;
}